

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O2

int __thiscall
Centaurus::CATNMachine<char>::import_literal_terminal
          (CATNMachine<char> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *literal,int origin,
          int tag)

{
  byte bVar1;
  pointer pcVar2;
  size_type sVar3;
  size_type sVar4;
  CharClass<char> local_50;
  
  pcVar2 = (literal->_M_dataplus)._M_p;
  sVar3 = literal->_M_string_length;
  for (sVar4 = 0; sVar3 != sVar4; sVar4 = sVar4 + 1) {
    bVar1 = pcVar2[sVar4];
    CharClass<char>::CharClass(&local_50,(uint)bVar1,(uint)bVar1 + L'\x01');
    origin = add_node(this,&local_50,origin,tag);
    CharClass<char>::~CharClass(&local_50);
    tag = 0;
  }
  return origin;
}

Assistant:

int import_literal_terminal(const std::basic_string<TCHAR>& literal, int origin, int tag)
    {
        for (TCHAR ch : literal)
        {
            origin = add_node(CharClass<TCHAR>(ch, ch + 1), origin, tag);
            tag = 0;
        }
        return origin;
    }